

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::SPxBasisBase<double>::load
          (SPxBasisBase<double> *this,SPxSolverBase<double> *lp,bool initSlackBasis)

{
  undefined3 in_register_00000011;
  
  this->theLP = lp;
  this->spxout = lp->spxout;
  setRep(this);
  if (CONCAT31(in_register_00000011,initSlackBasis) != 0) {
    restoreInitialBasis(this);
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
    return;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::load(SPxSolverBase<R>* lp, bool initSlackBasis)
{
   assert(lp != nullptr);
   theLP = lp;

   setOutstream(*theLP->spxout);

   setRep();

   if(initSlackBasis)
   {
      restoreInitialBasis();
      loadDesc(thedesc);
   }
}